

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void refs_rehash(refs_table_t *tbl,uint64_t v)

{
  uint64_t *puVar1;
  size_t sVar2;
  uint64_t uVar3;
  int iVar4;
  uint64_t d;
  int i;
  uint64_t *end;
  uint64_t *bucket;
  uint64_t v_local;
  refs_table_t *tbl_local;
  
  if ((v != 0) && (v != 0x7fffffffffffffff)) {
    puVar1 = tbl->refs_table;
    uVar3 = sylvan_fnvhash8(v & 0xffffffffff,0xcbf29ce484222325);
    end = puVar1 + uVar3 % tbl->refs_size;
    puVar1 = tbl->refs_table;
    sVar2 = tbl->refs_size;
    d._4_4_ = 0x80;
    while (iVar4 = d._4_4_ + -1, d._4_4_ != 0) {
      if (*end == 0) {
        LOCK();
        uVar3 = *end;
        if (uVar3 == 0) {
          *end = v;
        }
        UNLOCK();
        if (uVar3 == 0) {
          return;
        }
      }
      end = end + 1;
      d._4_4_ = iVar4;
      if (end == puVar1 + sVar2) {
        end = tbl->refs_table;
      }
    }
  }
  return;
}

Assistant:

static inline void
refs_rehash(refs_table_t *tbl, uint64_t v)
{
    if (v == 0) return; // do not rehash empty value
    if (v == refs_ts) return; // do not rehash tombstone

    _Atomic(uint64_t) *bucket = tbl->refs_table + (fnvhash8(v & 0x000000ffffffffff) % tbl->refs_size);
    _Atomic(uint64_t) * const end = tbl->refs_table + tbl->refs_size;

    int i = 128; // try 128 times linear probing
    while (i--) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d == 0) {
            if (atomic_compare_exchange_strong(bucket, &d, v)) return; 
        }
        if (++bucket == end) bucket = (_Atomic(uint64_t) *)tbl->refs_table;
    }

    // assert(0); // impossible!
}